

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprNodeIsConstant(Walker *pWalker,Expr *pExpr)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  
  uVar2 = pWalker->eCode;
  if ((uVar2 != 2) || ((pExpr->flags & 1) == 0)) {
    bVar1 = pExpr->op;
    if (bVar1 < 0x9d) {
      if (bVar1 == 0x3c) {
        iVar3 = sqlite3ExprIdToTrueFalse(pExpr);
        if (iVar3 != 0) {
          return 1;
        }
        goto switchD_0017cf62_caseD_a8;
      }
      if ((bVar1 != 0x48) && (bVar1 != 0x8e)) {
        return 0;
      }
    }
    else {
      iVar3 = 0;
      switch(bVar1) {
      case 0xa8:
      case 0xa9:
      case 0xaa:
switchD_0017cf62_caseD_a8:
        if (((pExpr->flags & 0x20) != 0) && (pWalker->eCode != 2)) goto LAB_0017d00a;
        if ((pWalker->eCode == 3) && (pExpr->iTable == (pWalker->u).n)) {
          return 0;
        }
        break;
      case 0xab:
      case 0xad:
      case 0xae:
      case 0xaf:
      case 0xb1:
      case 0xb2:
        goto switchD_0017cf62_caseD_ab;
      case 0xac:
        if (((3 < uVar2) || ((pExpr->flags & 0x100000) != 0)) && ((pExpr->flags >> 0x18 & 1) == 0))
        {
          if (uVar2 == 5) {
            pExpr->flags = pExpr->flags | 0x40000000;
          }
          goto LAB_0017d00a;
        }
        if (pWalker->pParse != (Parse *)0x0) {
          iVar3 = exprNodeIsConstantFunction(pWalker,pExpr);
          return iVar3;
        }
        break;
      case 0xb0:
      case 0xb3:
        break;
      default:
        if (bVar1 == 0x9d) {
          if (uVar2 == 4) break;
          if (uVar2 == 5) {
            pExpr->op = 'z';
          }
        }
LAB_0017d00a:
        iVar3 = 0;
        goto switchD_0017cf62_caseD_ab;
      }
    }
  }
  pWalker->eCode = 0;
  iVar3 = 2;
switchD_0017cf62_caseD_ab:
  return iVar3;
}

Assistant:

static int exprNodeIsConstant(Walker *pWalker, Expr *pExpr){
  assert( pWalker->eCode>0 );

  /* If pWalker->eCode is 2 then any term of the expression that comes from
  ** the ON or USING clauses of an outer join disqualifies the expression
  ** from being considered constant. */
  if( pWalker->eCode==2 && ExprHasProperty(pExpr, EP_OuterON) ){
    pWalker->eCode = 0;
    return WRC_Abort;
  }

  switch( pExpr->op ){
    /* Consider functions to be constant if all their arguments are constant
    ** and either pWalker->eCode==4 or 5 or the function has the
    ** SQLITE_FUNC_CONST flag. */
    case TK_FUNCTION:
      if( (pWalker->eCode>=4 || ExprHasProperty(pExpr,EP_ConstFunc))
       && !ExprHasProperty(pExpr, EP_WinFunc)
      ){
        if( pWalker->eCode==5 ) ExprSetProperty(pExpr, EP_FromDDL);
        return WRC_Continue;
      }else if( pWalker->pParse ){
        return exprNodeIsConstantFunction(pWalker, pExpr);
      }else{
        pWalker->eCode = 0;
        return WRC_Abort;
      }
    case TK_ID:
      /* Convert "true" or "false" in a DEFAULT clause into the
      ** appropriate TK_TRUEFALSE operator */
      if( sqlite3ExprIdToTrueFalse(pExpr) ){
        return WRC_Prune;
      }
      /* no break */ deliberate_fall_through
    case TK_COLUMN:
    case TK_AGG_FUNCTION:
    case TK_AGG_COLUMN:
      testcase( pExpr->op==TK_ID );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_AGG_FUNCTION );
      testcase( pExpr->op==TK_AGG_COLUMN );
      if( ExprHasProperty(pExpr, EP_FixedCol) && pWalker->eCode!=2 ){
        return WRC_Continue;
      }
      if( pWalker->eCode==3 && pExpr->iTable==pWalker->u.iCur ){
        return WRC_Continue;
      }
      /* no break */ deliberate_fall_through
    case TK_IF_NULL_ROW:
    case TK_REGISTER:
    case TK_DOT:
    case TK_RAISE:
      testcase( pExpr->op==TK_REGISTER );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      testcase( pExpr->op==TK_DOT );
      testcase( pExpr->op==TK_RAISE );
      pWalker->eCode = 0;
      return WRC_Abort;
    case TK_VARIABLE:
      if( pWalker->eCode==5 ){
        /* Silently convert bound parameters that appear inside of CREATE
        ** statements into a NULL when parsing the CREATE statement text out
        ** of the sqlite_schema table */
        pExpr->op = TK_NULL;
      }else if( pWalker->eCode==4 ){
        /* A bound parameter in a CREATE statement that originates from
        ** sqlite3_prepare() causes an error */
        pWalker->eCode = 0;
        return WRC_Abort;
      }
      /* no break */ deliberate_fall_through
    default:
      testcase( pExpr->op==TK_SELECT ); /* sqlite3SelectWalkFail() disallows */
      testcase( pExpr->op==TK_EXISTS ); /* sqlite3SelectWalkFail() disallows */
      return WRC_Continue;
  }
}